

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O0

CURLcode Curl_setblobopt(curl_blob **blobp,curl_blob *blob)

{
  undefined4 uVar1;
  curl_blob *pcVar2;
  size_t local_38;
  curl_blob *nblob;
  curl_blob *blob_local;
  curl_blob **blobp_local;
  
  (*Curl_cfree)(*blobp);
  *blobp = (curl_blob *)0x0;
  if (blob == (curl_blob *)0x0) {
    blobp_local._4_4_ = CURLE_OK;
  }
  else if (blob->len < 0x7a1201) {
    if ((blob->flags & 1) == 0) {
      local_38 = 0;
    }
    else {
      local_38 = blob->len;
    }
    pcVar2 = (curl_blob *)(*Curl_cmalloc)(local_38 + 0x18);
    if (pcVar2 == (curl_blob *)0x0) {
      blobp_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      pcVar2->data = blob->data;
      pcVar2->len = blob->len;
      uVar1 = *(undefined4 *)&blob->field_0x14;
      pcVar2->flags = blob->flags;
      *(undefined4 *)&pcVar2->field_0x14 = uVar1;
      if ((blob->flags & 1) != 0) {
        pcVar2->data = pcVar2 + 1;
        memcpy(pcVar2->data,blob->data,blob->len);
      }
      *blobp = pcVar2;
      blobp_local._4_4_ = CURLE_OK;
    }
  }
  else {
    blobp_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  return blobp_local._4_4_;
}

Assistant:

CURLcode Curl_setblobopt(struct curl_blob **blobp,
                         const struct curl_blob *blob)
{
  /* free the previous storage at `blobp' and replace by a dynamic storage
     copy of blob. If CURL_BLOB_COPY is set, the data is copied. */

  Curl_safefree(*blobp);

  if(blob) {
    struct curl_blob *nblob;
    if(blob->len > CURL_MAX_INPUT_LENGTH)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    nblob = (struct curl_blob *)
      malloc(sizeof(struct curl_blob) +
             ((blob->flags & CURL_BLOB_COPY) ? blob->len : 0));
    if(!nblob)
      return CURLE_OUT_OF_MEMORY;
    *nblob = *blob;
    if(blob->flags & CURL_BLOB_COPY) {
      /* put the data after the blob struct in memory */
      nblob->data = (char *)nblob + sizeof(struct curl_blob);
      memcpy(nblob->data, blob->data, blob->len);
    }

    *blobp = nblob;
    return CURLE_OK;
  }

  return CURLE_OK;
}